

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  Error *aError;
  long lVar5;
  ErrorCode local_13c;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  ErrorCode local_f8 [2];
  Error local_f0;
  thread local_c8;
  byte local_bd;
  int local_bc;
  undefined1 local_b8 [3];
  bool parseParams;
  int ch;
  string configFileName;
  string registryFileName;
  allocator local_61;
  undefined1 local_60 [8];
  string progName;
  Error error;
  char **argv_local;
  int argc_local;
  
  ot::commissioner::Error::Error((Error *)((long)&progName.field_2 + 8));
  pcVar1 = *argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_60,pcVar1,&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::string((string *)(configFileName.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_b8);
  local_bd = 1;
  while (iVar3 = _optind, (local_bd & 1) != 0) {
    local_bc = getopt_long(argc,argv,"hvc:r:",gCommissionerCliOptions,0);
    if (local_bc - 99U < 0x13 || local_bc == 0x76) {
      switch((long)&switchD_001c7a23::switchdataD_003a044c +
             (long)(int)(&switchD_001c7a23::switchdataD_003a044c)[local_bc - 99U]) {
      case 0x1c7a3f:
        PrintUsage((string *)local_60);
        goto LAB_001c7c41;
      case 0x1c7a62:
        PrintVersion();
        goto LAB_001c7c41;
      case 0x1c7a70:
        std::__cxx11::string::operator=((string *)(configFileName.field_2._M_local_buf + 8),_optarg)
        ;
        break;
      case 0x1c7a8a:
        std::__cxx11::string::operator=((string *)local_b8,_optarg);
        break;
      case 0x1c7aa4:
        goto switchD_001c7a23_caseD_1c7aa4;
      }
    }
    else {
switchD_001c7a23_caseD_1c7aa4:
      local_bd = 0;
    }
  }
  lVar5 = (long)_optind;
  uVar4 = std::__cxx11::string::empty();
  if (((uVar4 & 1) != 0) && (argc != iVar3)) {
    std::__cxx11::string::operator=((string *)local_b8,argv[lVar5]);
  }
  sigemptyset((sigset_t *)&gSignalSet);
  sigaddset((sigset_t *)&gSignalSet,2);
  pthread_sigmask(0,(__sigset_t *)&gSignalSet,(__sigset_t *)0x0);
  std::thread::thread<void(&)(),,void>(&local_c8,HandleSignalInterrupt);
  std::thread::detach();
  std::thread::~thread(&local_c8);
  ot::commissioner::Console::Write(&kLogo_abi_cxx11_,kBlue);
  ot::commissioner::Interpreter::Init
            (&local_f0,&gInterpreter,(string *)local_b8,
             (string *)((long)&configFileName.field_2 + 8));
  aError = ot::commissioner::Error::operator=((Error *)((long)&progName.field_2 + 8),&local_f0);
  local_f8[1] = 0;
  bVar2 = ot::commissioner::operator!=(aError,local_f8 + 1);
  ot::commissioner::Error::~Error(&local_f0);
  if (!bVar2) {
    ot::commissioner::Interpreter::Run(&gInterpreter);
  }
LAB_001c7c41:
  local_f8[0] = kNone;
  bVar2 = ot::commissioner::operator!=((Error *)((long)&progName.field_2 + 8),local_f8);
  if (bVar2) {
    ot::commissioner::Error::ToString_abi_cxx11_(&local_138,(Error *)((long)&progName.field_2 + 8));
    std::operator+(&local_118,"start OT-commissioner CLI failed: ",&local_138);
    ot::commissioner::Console::Write(&local_118,kRed);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
  }
  local_13c = kNone;
  bVar2 = ot::commissioner::operator==((Error *)((long)&progName.field_2 + 8),&local_13c);
  iVar3 = -1;
  if (bVar2) {
    iVar3 = 0;
  }
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)(configFileName.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_60);
  ot::commissioner::Error::~Error((Error *)((long)&progName.field_2 + 8));
  return iVar3;
}

Assistant:

int main(int argc, const char *argv[])
{
    using namespace ::ot::commissioner::utils;

    Error error;

    std::string progName = argv[0];
    std::string registryFileName;
    std::string configFileName;

    int  ch;
    bool parseParams = true;

    while (parseParams)
    {
        ch = getopt_long(argc, const_cast<char *const *>(argv), "hvc:r:", gCommissionerCliOptions, nullptr);
        switch (ch)
        {
        case 'h':
            PrintUsage(progName);
            ExitNow();
            break;
        case 'v':
            PrintVersion();
            ExitNow();
            break;
        case 'r':
            registryFileName = optarg;
            break;
        case 'c':
            configFileName = optarg;
            break;
        default:
            parseParams = false;
            break;
        };
    }
    argc -= optind;
    argv += optind;

    if (configFileName.empty())
    {
        // If any option left unprocessed then it must be a config file path
        if (argc != 0)
        {
            configFileName = argv[0];
        }
    }

    // Block signals in this thread and subsequently spawned threads.
    sigemptyset(&gSignalSet);
    sigaddset(&gSignalSet, SIGINT);
    pthread_sigmask(SIG_BLOCK, &gSignalSet, nullptr);

    std::thread(HandleSignalInterrupt).detach();

    Console::Write(kLogo, Console::Color::kBlue);

    SuccessOrExit(error = gInterpreter.Init(configFileName, registryFileName));

    gInterpreter.Run();

exit:
    if (error != ErrorCode::kNone)
    {
        Console::Write("start OT-commissioner CLI failed: " + error.ToString(), Console::Color::kRed);
    }
    return error == ErrorCode::kNone ? 0 : -1;
}